

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont * __thiscall ImFontAtlas::AddFontDefault(ImFontAtlas *this,ImFontConfig *font_cfg_template)

{
  ImFontConfig *font_cfg_00;
  ImFont *pIVar1;
  void *in_RSI;
  ImFontAtlas *in_RDI;
  ImFont *font;
  ImWchar *glyph_ranges;
  char *ttf_compressed_base85;
  ImFontConfig font_cfg;
  ImWchar *local_c8;
  undefined1 local_a0 [4];
  float in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  ImWchar *local_68;
  char local_46 [70];
  
  if (in_RSI == (void *)0x0) {
    ImFontConfig::ImFontConfig((ImFontConfig *)in_RDI);
  }
  else {
    memcpy(local_a0,in_RSI,0x90);
  }
  if (in_stack_ffffffffffffff74 <= 0.0) {
    in_stack_ffffffffffffff74 = 13.0;
  }
  if (local_46[0] == '\0') {
    ImFormatString(local_46,0x28,"ProggyClean.ttf, %dpx",(ulong)(uint)(int)in_stack_ffffffffffffff74
                  );
  }
  font_cfg_00 = (ImFontConfig *)GetDefaultCompressedFontDataTTFBase85();
  if (local_68 == (ImWchar *)0x0) {
    local_c8 = GetGlyphRangesDefault(in_RDI);
  }
  else {
    local_c8 = local_68;
  }
  pIVar1 = AddFontFromMemoryCompressedBase85TTF
                     ((ImFontAtlas *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,font_cfg_00,local_c8);
  return pIVar1;
}

Assistant:

ImFont* ImFontAtlas::AddFontDefault(const ImFontConfig* font_cfg_template)
{
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    if (!font_cfg_template)
    {
        font_cfg.OversampleH = font_cfg.OversampleV = 1;
        font_cfg.PixelSnapH = true;
    }
    if (font_cfg.SizePixels <= 0.0f)
        font_cfg.SizePixels = 13.0f * 1.0f;
    if (font_cfg.Name[0] == '\0')
        ImFormatString(font_cfg.Name, IM_ARRAYSIZE(font_cfg.Name), "ProggyClean.ttf, %dpx", (int)font_cfg.SizePixels);
    font_cfg.EllipsisChar = (ImWchar)0x0085;
    font_cfg.GlyphOffset.y = 1.0f * IM_TRUNC(font_cfg.SizePixels / 13.0f);  // Add +1 offset per 13 units

    const char* ttf_compressed_base85 = GetDefaultCompressedFontDataTTFBase85();
    const ImWchar* glyph_ranges = font_cfg.GlyphRanges != NULL ? font_cfg.GlyphRanges : GetGlyphRangesDefault();
    ImFont* font = AddFontFromMemoryCompressedBase85TTF(ttf_compressed_base85, font_cfg.SizePixels, &font_cfg, glyph_ranges);
    return font;
}